

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cc
# Opt level: O0

void __thiscall
prometheus::detail::CurlWrapper::CurlWrapper
          (CurlWrapper *this,function<void_(void_*)> *presetupCurl)

{
  bool bVar1;
  int iVar2;
  runtime_error *prVar3;
  CURL *pCVar4;
  curl_slist *pcVar5;
  CURLcode error;
  function<void_(void_*)> *presetupCurl_local;
  CurlWrapper *this_local;
  
  ::std::mutex::mutex(&this->mutex_);
  ::std::function<void_(void_*)>::function(&this->presetupCurl_,presetupCurl);
  iVar2 = curl_global_init(3);
  if (iVar2 != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar3,"Cannot initialize global curl!");
    __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar4 = (CURL *)curl_easy_init();
  this->curl_ = pCVar4;
  if (this->curl_ != (CURL *)0x0) {
    bVar1 = ::std::function::operator_cast_to_bool((function *)&this->presetupCurl_);
    if (bVar1) {
      ::std::function<void_(void_*)>::operator()(&this->presetupCurl_,this->curl_);
    }
    pcVar5 = (curl_slist *)
             curl_slist_append(0,"Content-Type: text/plain; version=0.0.4; charset=utf-8");
    this->optHttpHeader_ = pcVar5;
    if (this->optHttpHeader_ != (curl_slist *)0x0) {
      return;
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar3,"Cannot append the header of the content type");
    __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  curl_global_cleanup();
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(prVar3,"Cannot initialize easy curl!");
  __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

CurlWrapper::CurlWrapper(std::function<void(CURL*)> presetupCurl)
    : presetupCurl_(presetupCurl) {
  /* In windows, this will init the winsock stuff */
  auto error = curl_global_init(CURL_GLOBAL_ALL);
  if (error) {
    throw std::runtime_error("Cannot initialize global curl!");
  }

  curl_ = curl_easy_init();
  if (!curl_) {
    curl_global_cleanup();
    throw std::runtime_error("Cannot initialize easy curl!");
  }

  if (presetupCurl_) {
    presetupCurl_(curl_);  
  }

  optHttpHeader_ = curl_slist_append(nullptr, CONTENT_TYPE);
  if (!optHttpHeader_) {
    throw std::runtime_error("Cannot append the header of the content type");
  }
}